

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O2

void deserialize_run_container_empty(void)

{
  uint8_t data [11];
  
  data[0] = ';';
  data[1] = '0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\x01';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\0';
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  invalid_deserialize_test(data,0xb,"empty run container");
  return;
}

Assistant:

DEFINE_TEST(deserialize_run_container_empty) {
    // clang-format off
    const uint8_t data[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0x01,       // Run Flag Bitset (single container is a run)
        0, 0,       // Upper 16 bits of the first container
        0, 0,       // Cardinality - 1 of the first container
        0, 0,       // First Container - Number of runs
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data), "empty run container");
}